

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<float>_>::AutoFill
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  TPZVec<std::complex<float>_*> *this_00;
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int64_t j;
  long lVar5;
  int64_t i;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  complex<float> val;
  float local_68;
  TPZVec<long> skyline;
  
  if (nrow == ncol && symmetric != 0) {
    (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = nrow;
    (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = ncol;
    TPZVec<long>::TPZVec(&skyline,nrow);
    this_00 = &this->fElem;
    (*(this->fElem)._vptr_TPZVec[3])(this_00,nrow + 1);
    val._M_value = 0;
    TPZVec<std::complex<float>_*>::Fill(this_00,(complex<float> **)&val,0,-1);
    lVar4 = 0;
    lVar3 = 0;
    if (0 < nrow) {
      lVar3 = nrow;
    }
    for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      iVar2 = rand();
      skyline.fStore[lVar4] = (iVar2 * lVar4) / 0x7fffffff;
    }
    InitializeElem(&skyline,&this->fStorage,this_00);
    for (lVar4 = 0; lVar4 != lVar3; lVar4 = lVar4 + 1) {
      lVar5 = skyline.fStore[lVar4];
      local_68 = 0.0;
      for (; lVar5 < lVar4; lVar5 = lVar5 + 1) {
        TPZMatrix<std::complex<float>_>::GetRandomVal(&this->super_TPZMatrix<std::complex<float>_>);
        val._M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(this,lVar5,lVar4,&val);
        dVar1 = fabs((double)val._M_value);
        local_68 = local_68 + SUB84(dVar1,0);
      }
      val._M_value = (_ComplexT)(uint)(local_68 + 1.0);
      (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])(this,lVar4,lVar4,&val);
    }
    for (lVar4 = 0; lVar4 != lVar3; lVar4 = lVar4 + 1) {
      local_68 = 0.0;
      for (lVar5 = 0; nrow != lVar5; lVar5 = lVar5 + 1) {
        (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(this,lVar5,lVar4);
        dVar1 = fabs((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        local_68 = local_68 + SUB84(dVar1,0);
      }
      val._M_value = (_ComplexT)(uint)(local_68 + 1.0);
      (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])(this,lVar4,lVar4,&val);
    }
    TPZVec<long>::~TPZVec(&skyline);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
             ,0x6d4);
}

Assistant:

void TPZSkylMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    if (nrow != ncol || !symmetric)
    {
        DebugStop();
    }
    TPZMatrix<TVar>::Redim(nrow,ncol);
    TPZVec<int64_t> skyline(nrow);
    fElem.resize(nrow+1);
    fElem.Fill(0);
    for (int64_t i=0; i<nrow; i++) {
        skyline[i]=(i*(rand()))/RAND_MAX;
    }
//    std::cout << "skyline " << skyline << std::endl;
    InitializeElem(skyline,fStorage,fElem);
    
    for (int64_t i=0; i<nrow; i++) {
        TVar sum = 0.;
        for (int64_t j=skyline[i]; j<i; j++) {
            TVar val = this->GetRandomVal();
            if constexpr (is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            PutVal(j,i,val);
            sum += fabs(val);
        }
        PutVal(i,i,sum+(TVar)1.);
    }
    for (int64_t i=0; i<nrow; i++) {
        TVar sum = (TVar)0.;
        for (int64_t j=0; j<nrow; j++) {
            TVar val;
            val = GetVal(j,i);
            sum += fabs(val);
        }
        PutVal(i,i,sum+(TVar)1.);
    }

}